

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O0

double __thiscall
BayesianGameForDecPOMDPStage::ComputeDiscountedImmediateRewardForJPol
          (BayesianGameForDecPOMDPStage *this,shared_ptr<JointPolicyDiscretePure> *jpolBG,
          PlanningUnitFactoredDecPOMDPDiscrete *pu)

{
  uint uVar1;
  Index IVar2;
  size_t sVar3;
  type pJVar4;
  shared_ptr<JointPolicyDiscretePure> *in_RSI;
  BayesianGameForDecPOMDPStageInterface *in_RDI;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar11 [16];
  double discounted_r;
  double discT;
  double discount;
  double jt_r;
  double jt_prob;
  Index jaI;
  Index jt;
  size_t nrJT;
  double r;
  BayesianGameBase *in_stack_ffffffffffffffb0;
  uint local_2c;
  double local_20;
  
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  local_20 = 0.0;
  sVar3 = BayesianGameBase::GetNrJointTypes(in_stack_ffffffffffffffb0);
  local_2c = 0;
  while( true ) {
    uVar5 = auVar9._0_8_;
    auVar8 = in_ZMM1._0_16_;
    if (sVar3 <= local_2c) break;
    pJVar4 = boost::shared_ptr<JointPolicyDiscretePure>::operator->(in_RSI);
    uVar1 = (*(pJVar4->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x11])
                      (pJVar4,(ulong)local_2c);
    (*in_RDI[1]._vptr_BayesianGameForDecPOMDPStageInterface[0xd])(in_RDI + 1,(ulong)local_2c);
    uVar6 = uVar5;
    (*in_RDI->_vptr_BayesianGameForDecPOMDPStageInterface[2])(in_RDI,(ulong)local_2c,(ulong)uVar1,0)
    ;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar5;
    in_ZMM1 = ZEXT1664(auVar10);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar6;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_20;
    auVar8 = vfmadd213sd_fma(auVar8,auVar10,auVar11);
    auVar9 = ZEXT1664(auVar8);
    local_20 = auVar8._0_8_;
    local_2c = local_2c + 1;
  }
  dVar7 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x8b7642);
  IVar2 = BayesianGameForDecPOMDPStageInterface::GetStage(in_RDI);
  auVar8 = vcvtusi2sd_avx512f(auVar8,IVar2);
  dVar7 = pow(dVar7,auVar8._0_8_);
  return dVar7 * local_20;
}

Assistant:

double BayesianGameForDecPOMDPStage::
ComputeDiscountedImmediateRewardForJPol(const boost::shared_ptr<JointPolicyDiscretePure> &jpolBG,
                                        const PlanningUnitFactoredDecPOMDPDiscrete *pu) const
{
    //eval the expected future payoff of this jpolBG
    double r = 0.0; //immediate reward (exact)
    size_t nrJT = this->GetNrJointTypes();
    for(Index jt = 0; jt < nrJT ; jt++)
    {
        Index jaI = jpolBG->GetJointActionIndex(jt);
        double jt_prob = this->GetProbability(jt);
        double jt_r = this->GetImmediateReward(jt, jaI);
        r += jt_prob * jt_r;
    }
    double discount = _m_pu->GetDiscount();
    double discT = pow(discount , (double)(GetStage()) );
    double discounted_r = discT * r;
    return discounted_r;    
}